

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O0

void testMultiTiledPartThreading(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  exception *e;
  int size;
  int lm;
  int pt2;
  int pt1;
  int numThreads;
  string *in_stack_000000d0;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing the two threads reading/writing on two-tiled-part file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
        local_28 = 1;
        while( true ) {
          piVar3 = std::min<int>(&(anonymous_namespace)::width,&(anonymous_namespace)::height);
          if (*piVar3 <= local_28) break;
          (anonymous_namespace)::pixelTypes._0_4_ = local_1c;
          (anonymous_namespace)::pixelTypes._4_4_ = local_20;
          (anonymous_namespace)::levelMode = local_24;
          (anonymous_namespace)::tileSize = local_28;
          anon_unknown.dwarf_1ab374::testWriteRead(in_stack_000000d0);
          local_28 = local_28 + 0x32;
        }
      }
    }
  }
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testMultiTiledPartThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing the two threads reading/writing on two-tiled-part file"
             << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        for (int pt1 = 0; pt1 < 3; pt1++)
            for (int pt2 = 0; pt2 < 3; pt2++)
                for (int lm = 0; lm < 3; lm++)
                    for (int size = 1; size < min (width, height); size += 50)
                    {
                        pixelTypes[0] = pt1;
                        pixelTypes[1] = pt2;
                        levelMode     = lm;
                        tileSize      = size;
                        testWriteRead (tempDir);
                    }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}